

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

void ActionFuncLink::funcLinkInput(FuncCallSpecs *fc,Funcdata *data)

{
  uint *puVar1;
  PcodeOp *pPVar2;
  ProtoStore *pPVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  AddrSpace *spc;
  uintb off;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int4 iVar9;
  uint4 sz;
  undefined4 extraout_var;
  long *plVar10;
  Varnode *pVVar11;
  long lVar12;
  ulong uVar13;
  uint local_74;
  AddrSpace *local_68;
  Address local_40;
  undefined4 extraout_var_00;
  
  bVar6 = FuncProto::isInputLocked(&fc->super_FuncProto);
  local_74 = (fc->super_FuncProto).flags & 1;
  iVar7 = (*((fc->super_FuncProto).model)->input->_vptr_ParamList[0xd])();
  local_68 = (AddrSpace *)CONCAT44(extraout_var,iVar7);
  if (!bVar6 || local_74 != 0) {
    FuncCallSpecs::initActiveInput(fc);
  }
  if (bVar6) {
    pPVar2 = fc->op;
    uVar8 = (*((fc->super_FuncProto).store)->_vptr_ProtoStore[5])();
    if (0 < (int)uVar8) {
      lVar12 = 0;
      uVar13 = 0;
      do {
        pPVar3 = (fc->super_FuncProto).store;
        iVar7 = (*pPVar3->_vptr_ProtoStore[6])(pPVar3,uVar13);
        plVar10 = (long *)CONCAT44(extraout_var_00,iVar7);
        (**(code **)(*plVar10 + 0x20))(&local_40,plVar10);
        iVar9 = (**(code **)(*plVar10 + 0x28))(plVar10);
        ParamActive::registerTrial(&fc->activeinput,&local_40,iVar9);
        puVar1 = (uint *)((long)&((fc->activeinput).trial.
                                  super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->flags + lVar12);
        *puVar1 = *puVar1 | 9;
        (**(code **)(*plVar10 + 0x20))(&local_40,plVar10);
        spc = local_40.base;
        (**(code **)(*plVar10 + 0x20))(&local_40,plVar10);
        off = local_40.offset;
        sz = (**(code **)(*plVar10 + 0x28))(plVar10);
        if (spc->type == IPTR_SPACEBASE) {
          pVVar11 = Funcdata::opStackLoad(data,spc,off,sz,pPVar2,(Varnode *)0x0,false);
          Funcdata::opInsertInput
                    (data,pPVar2,pVVar11,
                     (int4)((ulong)((long)(pPVar2->inrefs).
                                          super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pPVar2->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 3));
          if (local_74 == 0) {
            Varnode::setFlags(pVVar11,0x1000);
            local_74 = 1;
            local_68 = (AddrSpace *)0x0;
          }
        }
        else {
          iVar9 = (**(code **)(*plVar10 + 0x28))(plVar10);
          (**(code **)(*plVar10 + 0x20))(&local_40,plVar10);
          pVVar11 = Funcdata::newVarnode(data,iVar9,&local_40,(Datatype *)0x0);
          Funcdata::opInsertInput
                    (data,pPVar2,pVVar11,
                     (int4)((ulong)((long)(pPVar2->inrefs).
                                          super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pPVar2->inrefs).
                                         super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        uVar13 = (ulong)((int)uVar13 + 1);
        lVar12 = lVar12 + 0x30;
      } while ((ulong)uVar8 * 0x30 != lVar12);
    }
  }
  if (local_68 != (AddrSpace *)0x0) {
    pPVar2 = fc->op;
    ppVVar4 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppVVar5 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar11 = Funcdata::opStackLoad(data,local_68,0,1,pPVar2,(Varnode *)0x0,false);
    iVar9 = (int4)((ulong)((long)ppVVar4 - (long)ppVVar5) >> 3);
    Funcdata::opInsertInput(data,pPVar2,pVVar11,iVar9);
    fc->stackPlaceholderSlot = iVar9;
    if (fc->isinputactive == true) {
      iVar7 = (fc->activeinput).slotbase;
      (fc->activeinput).stackplaceholder = iVar7;
      (fc->activeinput).slotbase = iVar7 + 1;
    }
    Varnode::setFlags(pVVar11,0x1000);
  }
  return;
}

Assistant:

void ActionFuncLink::funcLinkInput(FuncCallSpecs *fc,Funcdata &data)

{
  bool inputlocked = fc->isInputLocked();
  bool varargs = fc->isDotdotdot();
  AddrSpace *spacebase = fc->getSpacebase();	// Non-zero spacebase indicates we need a stackplaceholder
  ParamActive *active = fc->getActiveInput();

  if ((!inputlocked)||varargs)
    fc->initActiveInput();
  if (inputlocked) {
    PcodeOp *op = fc->getOp();
    int4 numparam = fc->numParams();
    bool setplaceholder = varargs;
    for(int4 i=0;i<numparam;++i) {
      ProtoParameter *param = fc->getParam(i);
      active->registerTrial(param->getAddress(),param->getSize());
      active->getTrial(i).markActive(); // Parameter is not optional
      AddrSpace *spc = param->getAddress().getSpace();
      uintb off = param->getAddress().getOffset();
      int4 sz = param->getSize();
      if (spc->getType() == IPTR_SPACEBASE) { // Param is stack relative
	Varnode *loadval = data.opStackLoad(spc,off,sz,op,(Varnode *)0,false);
	data.opInsertInput(op,loadval,op->numInput());
	if (!setplaceholder) {
	  setplaceholder = true;
	  loadval->setSpacebasePlaceholder();
	  spacebase = (AddrSpace *)0;	// With a locked stack parameter, we don't need a stackplaceholder
	}
      }
      else
	data.opInsertInput(op,data.newVarnode(param->getSize(),param->getAddress()),op->numInput());
    }
  }
  if (spacebase != (AddrSpace *)0) {	// If we need it, create the stackplaceholder
    PcodeOp *op = fc->getOp();
    int4 slot = op->numInput();
    Varnode *loadval = data.opStackLoad(spacebase,0,1,op,(Varnode *)0,false);
    data.opInsertInput(op,loadval,slot);
    fc->setStackPlaceholderSlot(slot);
    loadval->setSpacebasePlaceholder();
  }
}